

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
write_utf8_string(basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
                 string_view *sv)

{
  back_insert_iterator<jsoncons::binary_stream_sink> d_first;
  back_insert_iterator<jsoncons::binary_stream_sink> d_first_00;
  back_insert_iterator<jsoncons::binary_stream_sink> d_first_01;
  back_insert_iterator<jsoncons::binary_stream_sink> d_first_02;
  back_insert_iterator<jsoncons::binary_stream_sink> d_first_03;
  back_insert_iterator<jsoncons::binary_stream_sink> d_first_04;
  back_insert_iterator<jsoncons::binary_stream_sink> d_first_05;
  ulong uVar1;
  unsigned_long uVar2;
  const_iterator pvVar3;
  const_iterator pvVar4;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  undefined8 in_RDI;
  value_type c;
  const_iterator __end3;
  const_iterator __begin3;
  string_view *__range3;
  size_t length;
  binary_stream_sink *in_stack_ffffffffffffff58;
  ulong in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined2 in_stack_ffffffffffffff74;
  char in_stack_ffffffffffffff76;
  char cVar5;
  char in_stack_ffffffffffffff77;
  uchar uVar6;
  unsigned_short val;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  unsigned_long in_stack_ffffffffffffff88;
  uint val_00;
  back_insert_iterator<jsoncons::binary_stream_sink> in_stack_ffffffffffffff90;
  
  uVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size(in_RSI);
  val = (unsigned_short)((ulong)in_RDI >> 0x30);
  cVar5 = (char)uVar1;
  if (uVar1 < 0x18) {
    in_stack_ffffffffffffff77 = cVar5 + '`';
    std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffff58);
    d_first.container._7_1_ = in_stack_ffffffffffffff87;
    d_first.container._0_7_ = in_stack_ffffffffffffff80;
    binary::
    native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              ((uchar)((ulong)in_RDI >> 0x38),d_first);
    uVar1 = in_stack_ffffffffffffff68;
  }
  else if (uVar1 < 0x100) {
    std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffff58);
    uVar6 = (uchar)((ulong)in_RDI >> 0x38);
    d_first_00.container._7_1_ = in_stack_ffffffffffffff87;
    d_first_00.container._0_7_ = in_stack_ffffffffffffff80;
    binary::
    native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              (uVar6,d_first_00);
    std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffff58);
    d_first_01.container._7_1_ = in_stack_ffffffffffffff87;
    d_first_01.container._0_7_ = in_stack_ffffffffffffff80;
    binary::
    native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              (uVar6,d_first_01);
    uVar1 = in_stack_ffffffffffffff68;
    in_stack_ffffffffffffff76 = cVar5;
  }
  else if (uVar1 < 0x10000) {
    std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffff58);
    d_first_02.container._7_1_ = in_stack_ffffffffffffff87;
    d_first_02.container._0_7_ = in_stack_ffffffffffffff80;
    binary::
    native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              ((uchar)(val >> 8),d_first_02);
    in_stack_ffffffffffffff74 = (undefined2)uVar1;
    std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffff58);
    d_first_03.container._7_1_ = in_stack_ffffffffffffff87;
    d_first_03.container._0_7_ = in_stack_ffffffffffffff80;
    binary::
    native_to_big<unsigned_short,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              (val,d_first_03);
    uVar1 = in_stack_ffffffffffffff68;
  }
  else if (uVar1 < 0x100000000) {
    std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffff58);
    val_00 = (uint)(in_stack_ffffffffffffff88 >> 0x20);
    d_first_04.container._7_1_ = in_stack_ffffffffffffff87;
    d_first_04.container._0_7_ = in_stack_ffffffffffffff80;
    binary::
    native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              ((uchar)((ulong)in_RDI >> 0x38),d_first_04);
    in_stack_ffffffffffffff70 = (undefined4)uVar1;
    std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffff58);
    binary::
    native_to_big<unsigned_int,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              (val_00,in_stack_ffffffffffffff90);
    uVar1 = in_stack_ffffffffffffff68;
  }
  else {
    uVar2 = std::numeric_limits<unsigned_long>::max();
    uVar6 = (uchar)((ulong)in_RDI >> 0x38);
    if (uVar1 <= uVar2) {
      std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffff58);
      d_first_05.container._7_1_ = in_stack_ffffffffffffff87;
      d_first_05.container._0_7_ = in_stack_ffffffffffffff80;
      binary::
      native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                (uVar6,d_first_05);
      std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffff58);
      binary::
      native_to_big<unsigned_long,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                (in_stack_ffffffffffffff88,in_stack_ffffffffffffff90);
    }
  }
  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::begin(in_RSI);
  pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::end(in_RSI);
  for (; pvVar3 != pvVar4; pvVar3 = pvVar3 + 1) {
    binary_stream_sink::push_back
              ((binary_stream_sink *)
               CONCAT17(in_stack_ffffffffffffff77,
                        CONCAT16(in_stack_ffffffffffffff76,
                                 CONCAT24(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))),
               (uint8_t)(uVar1 >> 0x38));
  }
  return;
}

Assistant:

void write_utf8_string(const string_view& sv)
    {
        const size_t length = sv.size();

        if (length <= 0x17)
        {
            // fixstr stores a byte array whose length is upto 31 bytes
            binary::native_to_big(static_cast<uint8_t>(0x60 + length), 
                                            std::back_inserter(sink_));
        }
        else if (length <= 0xff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x78), 
                                            std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint8_t>(length), 
                                            std::back_inserter(sink_));
        }
        else if (length <= 0xffff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x79), 
                                            std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint16_t>(length), 
                                            std::back_inserter(sink_));
        }
        else if (length <= 0xffffffff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x7a), 
                                            std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint32_t>(length), 
                                            std::back_inserter(sink_));
        }
        else if (uint64_t(length) <= (std::numeric_limits<std::uint64_t>::max)())
        {
            binary::native_to_big(static_cast<uint8_t>(0x7b), 
                                            std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint64_t>(length), 
                                            std::back_inserter(sink_));
        }

        for (auto c : sv)
        {
            sink_.push_back(c);
        }
    }